

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyedgecurve.cpp
# Opt level: O0

bool __thiscall ON_PolyEdgeCurve::ChangeClosedCurveSeam(ON_PolyEdgeCurve *this,double t)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  double *pdVar6;
  double dStack_78;
  bool rc;
  double st [3];
  ON_PolyEdgeSegment *right_seg;
  double segt;
  ON_Curve *right;
  ON_Curve *left;
  ON_PolyEdgeSegment *left_seg;
  double s;
  ON_Interval crvd;
  double t_local;
  ON_PolyEdgeCurve *this_local;
  
  crvd.m_t[1] = t;
  iVar4 = SegmentCount(this);
  if (iVar4 == 1) {
    uVar5 = (*(this->super_ON_PolyCurve).super_ON_Curve.super_ON_Geometry.super_ON_Object.
              _vptr_ON_Object[0x34])();
    if ((uVar5 & 1) == 0) {
      return false;
    }
    (*(this->super_ON_PolyCurve).super_ON_Curve.super_ON_Geometry.super_ON_Object._vptr_ON_Object
      [0x25])();
    left_seg = (ON_PolyEdgeSegment *)
               ON_Interval::NormalizedParameterAt((ON_Interval *)&s,crvd.m_t[1]);
    if (((double)left_seg <= 1.490116119385e-08) || (0.9999999850988388 <= (double)left_seg)) {
      left_seg = (ON_PolyEdgeSegment *)fmod((double)left_seg,1.0);
      dVar1 = crvd.m_t[1];
      if ((double)left_seg < 0.0) {
        left_seg = (ON_PolyEdgeSegment *)((double)left_seg + 1.0);
      }
      if ((1.490116119385e-08 < ABS((double)left_seg)) &&
         (1.490116119385e-08 < ABS(1.0 - (double)left_seg))) {
        return false;
      }
      pdVar6 = ON_Interval::operator[]((ON_Interval *)&s,0);
      if ((dVar1 != *pdVar6) || (NAN(dVar1) || NAN(*pdVar6))) {
        (*(this->super_ON_PolyCurve).super_ON_Curve.super_ON_Geometry.super_ON_Object.
          _vptr_ON_Object[0x17])(this,1);
        dVar2 = crvd.m_t[1];
        dVar1 = ON_Interval::Length((ON_Interval *)&s);
        (*(this->super_ON_PolyCurve).super_ON_Curve.super_ON_Geometry.super_ON_Object.
          _vptr_ON_Object[0x26])(SUB84(dVar2,0),dVar2 + dVar1);
      }
      return true;
    }
    left = (ON_Curve *)SegmentCurve(this,0);
    if ((ON_PolyEdgeSegment *)left == (ON_PolyEdgeSegment *)0x0) {
      return false;
    }
    (*(this->super_ON_PolyCurve).super_ON_Curve.super_ON_Geometry.super_ON_Object._vptr_ON_Object
      [0x17])(this,1);
    right = left;
    segt = 0.0;
    dVar1 = ON_PolyCurve::SegmentCurveParameter(&this->super_ON_PolyCurve,crvd.m_t[1]);
    uVar5 = (*(left->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3e])
                      (SUB84(dVar1,0),left,&right,&segt);
    if ((uVar5 & 1) == 0) {
      return false;
    }
    pdVar6 = ON_Interval::operator[]((ON_Interval *)&s,0);
    (*(this->super_ON_PolyCurve).super_ON_Curve.super_ON_Geometry.super_ON_Object._vptr_ON_Object
      [0x26])(SUB84(*pdVar6,0),crvd.m_t[1]);
    st[2] = (double)ON_PolyEdgeSegment::Cast((ON_Object *)segt);
    if ((ON_PolyEdgeSegment *)st[2] == (ON_PolyEdgeSegment *)0x0) {
      return false;
    }
    Append(this,(ON_PolyEdgeSegment *)st[2]);
    pdVar6 = ON_Interval::operator[]((ON_Interval *)&s,0);
    dStack_78 = *pdVar6;
    st[0] = crvd.m_t[1];
    pdVar6 = ON_Interval::operator[]((ON_Interval *)&s,1);
    st[1] = *pdVar6;
    ON_PolyCurve::SetParameterization(&this->super_ON_PolyCurve,&stack0xffffffffffffff88);
  }
  bVar3 = ON_PolyCurve::ChangeClosedCurveSeam(&this->super_ON_PolyCurve,crvd.m_t[1]);
  return bVar3;
}

Assistant:

bool ON_PolyEdgeCurve::ChangeClosedCurveSeam( double t )
{
  //int saved_is_closed_helper = m_is_closed_helper;

  if ( SegmentCount() == 1 )
  {
    // A ON_PolyEdgeSegment cannot have its start/end
    // changed. Split it into two segments and let 
    // ON_PolyCurve::ChangeClosedCurveSeam() do the work.
    if ( !IsClosed() )
      return false;

    ON_Interval crvd = Domain();
    double s = crvd.NormalizedParameterAt(t);

    if ( s <= ON_SQRT_EPSILON || s >= (1.0 - ON_SQRT_EPSILON) )
    {
      s = fmod(s,1.0);
      if ( s < 0.0 )
        s += 1.0;
      if ( fabs(s) <= ON_SQRT_EPSILON || fabs(1.0-s) <= ON_SQRT_EPSILON )
      {
        // split parameter is at start/end of this segment
        if ( t != crvd[0] )
        {
          DestroyRuntimeCache();
          SetDomain(t,t+crvd.Length() );
          //m_is_closed_helper = saved_is_closed_helper;
        }
        return true;
      }
      return false;
    }

    ON_PolyEdgeSegment* left_seg = SegmentCurve(0);
    if ( 0 == left_seg )
      return false;

    DestroyRuntimeCache();

    ON_Curve* left = left_seg;
    ON_Curve* right = 0;
    double segt = SegmentCurveParameter(t);
    if ( !left_seg->Split(segt,left,right) )
      return false;
    SetDomain(crvd[0],t);
    
    ON_PolyEdgeSegment* right_seg = ON_PolyEdgeSegment::Cast(right);
    if ( 0 == right_seg )
      return false;
    Append(right_seg);

    double st[3];
    st[0] = crvd[0];
    st[1] = t;
    st[2] = crvd[1];
    SetParameterization( st );
  }

  // ON_PolyCurve::ChangeClosedCurveSeam works fine on
  // two or more segments.
  bool rc = ON_PolyCurve::ChangeClosedCurveSeam(t);
  //if ( saved_is_closed_helper )
  //  m_is_closed_helper = saved_is_closed_helper;

  return rc;
}